

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O3

SUNErrCode SUNMatMatvec_Dense(SUNMatrix A,N_Vector x,N_Vector y)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  void *__s;
  long lVar7;
  long lVar8;
  
  lVar6 = N_VGetArrayPointer(x);
  __s = (void *)N_VGetArrayPointer();
  plVar1 = (long *)A->content;
  lVar2 = *plVar1;
  if (0 < lVar2) {
    memset(__s,0,lVar2 * 8);
  }
  lVar3 = plVar1[1];
  if (0 < lVar3) {
    lVar4 = plVar1[4];
    lVar7 = 0;
    do {
      if (0 < lVar2) {
        lVar5 = *(long *)(lVar4 + lVar7 * 8);
        lVar8 = 0;
        do {
          *(double *)((long)__s + lVar8 * 8) =
               *(double *)(lVar5 + lVar8 * 8) * *(double *)(lVar6 + lVar7 * 8) +
               *(double *)((long)__s + lVar8 * 8);
          lVar8 = lVar8 + 1;
        } while (lVar2 != lVar8);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar3);
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatMatvec_Dense(SUNMatrix A, N_Vector x, N_Vector y)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j;
  sunrealtype *col_j, *xd, *yd;

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrixAndVectors(A, x, y), SUN_ERR_ARG_DIMSMISMATCH);

  /* access vector data (return if NULL data pointers) */
  xd = N_VGetArrayPointer(x);
  SUNCheckLastErr();
  yd = N_VGetArrayPointer(y);
  SUNCheckLastErr();

  SUNAssert(xd, SUN_ERR_MEM_FAIL);
  SUNAssert(yd, SUN_ERR_MEM_FAIL);
  SUNAssert(xd != yd, SUN_ERR_MEM_FAIL);

  /* Perform operation y = Ax */
  for (i = 0; i < SM_ROWS_D(A); i++) { yd[i] = ZERO; }
  for (j = 0; j < SM_COLUMNS_D(A); j++)
  {
    col_j = SM_COLUMN_D(A, j);
    for (i = 0; i < SM_ROWS_D(A); i++) { yd[i] += col_j[i] * xd[j]; }
  }
  return SUN_SUCCESS;
}